

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

void __thiscall
TreePropagator::DFSBlue
          (TreePropagator *this,int r,vector<bool,_std::allocator<bool>_> *visited,int *count)

{
  uint uVar1;
  pointer pvVar2;
  long lVar3;
  BoolView *pBVar4;
  uint *puVar5;
  bool bVar6;
  size_type __n;
  uint uVar7;
  reference rVar8;
  
  __n = (size_type)r;
  rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,__n);
  *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
  *count = *count + 1;
  uVar7 = 0;
  while( true ) {
    pvVar2 = (this->super_GraphPropagator).adj.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)&pvVar2[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar2[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar3 >> 2) <= (ulong)uVar7) break;
    uVar1 = *(uint *)(lVar3 + (ulong)uVar7 * 4);
    pBVar4 = (this->super_GraphPropagator).es.data;
    if ((sat.assigns.data[(uint)pBVar4[uVar1].v] == '\0') ||
       (bVar6 = BoolView::isFalse(pBVar4 + uVar1), !bVar6)) {
      pBVar4 = (this->super_GraphPropagator).vs.data;
      puVar5 = *(uint **)&(this->super_GraphPropagator).endnodes.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar1].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
      uVar1 = *puVar5;
      if (uVar1 == r) {
        uVar1 = puVar5[1];
      }
      if (((sat.assigns.data[(uint)pBVar4[uVar1].v] == '\0') ||
          (bVar6 = BoolView::isFalse(pBVar4 + uVar1), !bVar6)) &&
         (rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,(long)(int)uVar1),
         (*rVar8._M_p & rVar8._M_mask) == 0)) {
        DFSBlue(this,uVar1,visited,count);
      }
    }
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void TreePropagator::DFSBlue(int r, std::vector<bool>& visited, int& count) {
	visited[r] = true;
	count++;
	for (unsigned int i = 0; i < adj[r].size(); i++) {
		const int e = adj[r][i];
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			continue;
		}
		const int e1 = getEndnode(e, 1);
		const int e0 = getEndnode(e, 0);
		const int other = e0 == r ? e1 : e0;
		if (getNodeVar(other).isFixed() && getNodeVar(other).isFalse()) {
			continue;
		}
		if (visited[other] == false) {
			DFSBlue(other, visited, count);
		}
	}
}